

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

int Gia_ManQuantVerify_rec(Gia_Man_t *p,int iObj,int CiId)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  undefined1 local_29;
  Gia_Obj_t *pObj;
  int CiId_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      iVar1 = Gia_ManQuantVerify_rec(p,iVar1,CiId);
      local_29 = true;
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
        iVar1 = Gia_ManQuantVerify_rec(p,iVar1,CiId);
        local_29 = iVar1 != 0;
      }
      p_local._4_4_ = (uint)local_29;
    }
    else {
      iVar1 = Gia_ObjCioId(pObj_00);
      p_local._4_4_ = (uint)(iVar1 == CiId);
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManQuantVerify_rec( Gia_Man_t * p, int iObj, int CiId )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return 0;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjCioId(pObj) == CiId;
    return Gia_ManQuantVerify_rec( p, Gia_ObjFaninId0(pObj, iObj), CiId ) ||
           Gia_ManQuantVerify_rec( p, Gia_ObjFaninId1(pObj, iObj), CiId );
}